

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

void refreshLine(linenoiseState *l)

{
  size_t sVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  linenoiseState *plVar5;
  undefined8 uVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  size_t sVar18;
  int iVar19;
  uint uVar20;
  size_t sVar21;
  char seq [64];
  abuf local_b8;
  char *local_a8;
  char *local_a0;
  size_t local_98;
  linenoiseState *local_90;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  undefined2 local_70;
  
  local_90 = l;
  if (mlmode == 0) {
    pcVar8 = l->prompt;
    local_a0 = (char *)strlen(pcVar8);
    local_80 = l->buf;
    pcVar9 = (char *)l->len;
    local_a8 = local_a0 + l->pos;
    pcVar10 = (char *)l->cols;
    if (pcVar10 <= local_a8) {
      pcVar12 = pcVar10 + -1;
      if (local_a8 + -1 < pcVar10 + -1) {
        pcVar12 = local_a8 + -1;
      }
      local_80 = local_80 + ((long)local_a8 - (long)pcVar12);
      pcVar9 = pcVar12 + ((long)pcVar9 - (long)local_a8);
      local_a8 = pcVar12;
    }
    local_98 = CONCAT44(local_98._4_4_,l->ofd);
    pcVar12 = pcVar9 + (long)local_a0;
    if (pcVar10 < pcVar9 + (long)local_a0) {
      pcVar12 = pcVar10;
    }
    local_b8.b = (char *)0x0;
    local_b8.len = 0;
    local_78 = CONCAT62(local_78._2_6_,0xd);
    sVar7 = strlen((char *)&local_78);
    uVar13 = (uint)sVar7;
    pcVar9 = (char *)malloc((long)(int)uVar13);
    if (pcVar9 == (char *)0x0) {
      sVar7 = 0;
    }
    else {
      memcpy(pcVar9,&local_78,(long)(int)uVar13);
      local_b8.b = pcVar9;
      local_b8.len = uVar13;
    }
    sVar21 = strlen(pcVar8);
    uVar13 = (int)sVar21 + (int)sVar7;
    uVar14 = (ulong)uVar13;
    pcVar10 = (char *)realloc(pcVar9,(long)(int)uVar13);
    if (pcVar10 == (char *)0x0) {
      uVar14 = sVar7 & 0xffffffff;
    }
    else {
      memcpy(pcVar10 + (int)sVar7,pcVar8,(long)(int)sVar21);
      pcVar9 = pcVar10;
      local_b8.b = pcVar10;
      local_b8.len = uVar13;
    }
    plVar5 = local_90;
    uVar13 = (uint)uVar14;
    if (maskmode == '\x01') {
      uVar20 = uVar13;
      if ((long)pcVar12 - (long)local_a0 != 0) {
        lVar16 = (long)local_a0 - (long)pcVar12;
        do {
          uVar20 = (uint)uVar14;
          pcVar8 = (char *)realloc(pcVar9,(long)(int)(uVar20 + 1));
          if (pcVar8 != (char *)0x0) {
            pcVar8[(int)uVar20] = '*';
            pcVar9 = pcVar8;
            uVar20 = uVar20 + 1;
          }
          uVar14 = (ulong)uVar20;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0);
      }
    }
    else {
      iVar19 = (int)((long)pcVar12 - (long)local_a0);
      uVar17 = uVar13 + iVar19;
      pcVar8 = (char *)realloc(pcVar9,(long)(int)uVar17);
      pcVar9 = local_b8.b;
      uVar20 = local_b8.len;
      if (pcVar8 != (char *)0x0) {
        memcpy(pcVar8 + (int)uVar13,local_80,(long)iVar19);
        pcVar9 = pcVar8;
        uVar20 = uVar17;
      }
    }
    local_b8.len = uVar20;
    local_b8.b = pcVar9;
    refreshShowHints(&local_b8,plVar5,(int)local_a0);
    uVar14 = (ulong)local_78 >> 0x20;
    local_78 = CONCAT44((uint)uVar14 & 0xffffff00,0x4b305b1b);
    sVar21 = strlen((char *)&local_78);
    uVar13 = local_b8.len;
    pcVar8 = local_b8.b;
    uVar20 = (int)sVar21 + local_b8.len;
    pcVar9 = (char *)realloc(local_b8.b,(long)(int)uVar20);
    sVar7 = (size_t)(int)uVar13;
    if (pcVar9 != (char *)0x0) {
      memcpy(pcVar9 + sVar7,&local_78,(long)(int)sVar21);
      sVar7 = (long)(int)uVar20;
      pcVar8 = pcVar9;
      uVar13 = uVar20;
    }
    snprintf((char *)&local_78,0x40,"\r\x1b[%dC",local_a8);
    sVar21 = strlen((char *)&local_78);
    sVar18 = (size_t)(int)((int)sVar21 + uVar13);
    pcVar9 = (char *)realloc(pcVar8,sVar18);
    if (pcVar9 != (char *)0x0) {
      memcpy(pcVar9 + sVar7,&local_78,(long)(int)sVar21);
      sVar7 = sVar18;
      pcVar8 = pcVar9;
    }
    iVar19 = (int)local_98;
    goto LAB_00103b77;
  }
  local_98 = strlen(l->prompt);
  local_a8 = (char *)(long)(int)local_98;
  uVar14 = l->cols;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar14;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_a8 + l->len + uVar14 + -1;
  uVar6 = SUB168(auVar4 / auVar3,0);
  iVar19 = (int)l->maxrows;
  iVar11 = SUB164(auVar4 / auVar3,0);
  if (iVar19 < iVar11) {
    l->maxrows = (long)iVar11;
  }
  local_80 = (char *)CONCAT44(local_80._4_4_,l->ofd);
  if ((int)((ulong)(local_a8 + l->oldpos + uVar14) / uVar14) < iVar19) {
    snprintf((char *)&local_78,0x40,"\x1b[%dB");
    sVar7 = strlen((char *)&local_78);
    local_a0 = (char *)malloc((long)(int)sVar7);
    if (local_a0 == (char *)0x0) goto LAB_00103553;
    memcpy(local_a0,&local_78,(long)(int)sVar7);
    uVar14 = sVar7 & 0xffffffff;
  }
  else {
LAB_00103553:
    uVar14 = 0;
    local_a0 = (char *)0x0;
  }
  local_88 = uVar6;
  if (1 < iVar19) {
    iVar19 = iVar19 + -1;
    do {
      local_78 = 0x315b1b4b305b1b0d;
      local_70 = 0x41;
      sVar7 = strlen((char *)&local_78);
      uVar13 = (int)sVar7 + (int)uVar14;
      pcVar8 = (char *)realloc(local_a0,(long)(int)uVar13);
      if (pcVar8 != (char *)0x0) {
        memcpy(pcVar8 + (int)uVar14,&local_78,(long)(int)sVar7);
        uVar14 = (ulong)uVar13;
        local_a0 = pcVar8;
      }
      iVar19 = iVar19 + -1;
    } while (iVar19 != 0);
  }
  pcVar8 = local_a0;
  local_b8.b = local_a0;
  uVar13 = (uint)uVar14;
  local_78 = CONCAT26(local_78._6_2_,0x4b305b1b0d);
  local_b8.len = uVar13;
  sVar7 = strlen((char *)&local_78);
  uVar20 = (int)sVar7 + uVar13;
  pcVar9 = (char *)realloc(pcVar8,(long)(int)uVar20);
  if (pcVar9 != (char *)0x0) {
    memcpy(pcVar9 + (int)uVar13,&local_78,(long)(int)sVar7);
    pcVar8 = pcVar9;
    uVar14 = (ulong)uVar20;
    local_b8.b = pcVar9;
    local_b8.len = uVar20;
  }
  pcVar9 = local_90->prompt;
  sVar7 = strlen(pcVar9);
  uVar13 = (int)sVar7 + (int)uVar14;
  pcVar10 = (char *)realloc(pcVar8,(long)(int)uVar13);
  if (pcVar10 != (char *)0x0) {
    memcpy(pcVar10 + (int)uVar14,pcVar9,(long)(int)sVar7);
    uVar14 = (ulong)uVar13;
    pcVar8 = pcVar10;
    local_b8.b = pcVar10;
    local_b8.len = uVar13;
  }
  plVar5 = local_90;
  uVar13 = (uint)uVar14;
  if (maskmode == '\x01') {
    uVar20 = uVar13;
    if (local_90->len != 0) {
      uVar15 = 1;
      do {
        uVar20 = (uint)uVar14;
        pcVar9 = (char *)realloc(pcVar8,(long)(int)(uVar20 + 1));
        if (pcVar9 != (char *)0x0) {
          pcVar9[(int)uVar20] = '*';
          pcVar8 = pcVar9;
          uVar20 = uVar20 + 1;
        }
        uVar14 = (ulong)uVar20;
        bVar2 = uVar15 < plVar5->len;
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (bVar2);
    }
  }
  else {
    pcVar9 = local_90->buf;
    iVar19 = (int)local_90->len;
    uVar17 = uVar13 + iVar19;
    pcVar10 = (char *)realloc(pcVar8,(long)(int)uVar17);
    pcVar8 = local_b8.b;
    uVar20 = local_b8.len;
    if (pcVar10 != (char *)0x0) {
      memcpy(pcVar10 + (int)uVar13,pcVar9,(long)iVar19);
      pcVar8 = pcVar10;
      uVar20 = uVar17;
    }
  }
  local_b8.len = uVar20;
  local_b8.b = pcVar8;
  iVar19 = (int)local_98;
  refreshShowHints(&local_b8,plVar5,iVar19);
  uVar13 = local_b8.len;
  pcVar8 = local_b8.b;
  sVar1 = plVar5->pos;
  iVar11 = (int)local_88;
  if (((sVar1 != 0) && (sVar1 == plVar5->len)) && ((ulong)(local_a8 + sVar1) % plVar5->cols == 0)) {
    lVar16 = (long)local_b8.len;
    sVar7 = lVar16 + 1;
    pcVar9 = (char *)realloc(local_b8.b,sVar7);
    if (pcVar9 != (char *)0x0) {
      pcVar9[lVar16] = '\n';
      uVar13 = (uint)sVar7;
      pcVar8 = pcVar9;
      local_b8.b = pcVar9;
      local_b8.len = uVar13;
    }
    local_78 = CONCAT62(local_78._2_6_,0xd);
    sVar7 = strlen((char *)&local_78);
    uVar20 = (int)sVar7 + uVar13;
    pcVar8 = (char *)realloc(pcVar8,(long)(int)uVar20);
    if (pcVar8 != (char *)0x0) {
      memcpy(pcVar8 + (int)uVar13,&local_78,(long)(int)sVar7);
      local_b8.b = pcVar8;
      local_b8.len = uVar20;
    }
    iVar11 = (int)local_88 + 1;
    if ((int)plVar5->maxrows <= (int)local_88) {
      plVar5->maxrows = (long)iVar11;
    }
    iVar19 = (int)local_98;
  }
  if ((int)((ulong)(local_a8 + plVar5->cols + plVar5->pos) / plVar5->cols) < iVar11) {
    snprintf((char *)&local_78,0x40,"\x1b[%dA");
    sVar7 = strlen((char *)&local_78);
    lVar16 = (long)local_b8.len;
    sVar21 = (int)sVar7 + lVar16;
    pcVar8 = (char *)realloc(local_b8.b,sVar21);
    if (pcVar8 != (char *)0x0) {
      memcpy(pcVar8 + lVar16,&local_78,(long)(int)sVar7);
      local_b8.len = (int)sVar21;
      local_b8.b = pcVar8;
    }
  }
  uVar14 = (long)(iVar19 + (int)local_90->pos) % (long)(int)local_90->cols;
  if ((int)uVar14 == 0) {
    local_78 = CONCAT62(local_78._2_6_,0xd);
  }
  else {
    snprintf((char *)&local_78,0x40,"\r\x1b[%dC",uVar14 & 0xffffffff);
  }
  sVar21 = strlen((char *)&local_78);
  pcVar8 = local_b8.b;
  sVar7 = (size_t)local_b8.len;
  sVar18 = (long)(int)sVar21 + sVar7;
  pcVar9 = (char *)realloc(local_b8.b,sVar18);
  if (pcVar9 != (char *)0x0) {
    memcpy(pcVar9 + sVar7,&local_78,(long)(int)sVar21);
    sVar7 = sVar18;
    pcVar8 = pcVar9;
  }
  local_90->oldpos = local_90->pos;
  iVar19 = (int)local_80;
LAB_00103b77:
  write(iVar19,pcVar8,sVar7);
  free(pcVar8);
  return;
}

Assistant:

static void refreshLine(struct linenoiseState *l) {
    if (mlmode)
        refreshMultiLine(l);
    else
        refreshSingleLine(l);
}